

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::saveVectors(FastText *this,string *filename)

{
  char cVar1;
  int32_t iVar2;
  ostream *poVar3;
  invalid_argument *this_00;
  int id;
  Vector vec;
  string word;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs,(string *)filename,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    iVar2 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    poVar3 = (ostream *)std::ostream::operator<<(&ofs,iVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,((this->args_).
                                super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->dim);
    std::endl<char,std::char_traits<char>>(poVar3);
    Vector::Vector(&vec,(long)((this->args_).
                               super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              )->dim);
    id = 0;
    while( true ) {
      iVar2 = Dictionary::nwords((this->dict_).
                                 super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
      if (iVar2 <= id) break;
      Dictionary::getWord_abi_cxx11_
                (&word,(this->dict_).
                       super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 id);
      getWordVector(this,&vec,&word);
      poVar3 = std::operator<<((ostream *)&ofs,(string *)&word);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = operator<<(poVar3,&vec);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&word);
      id = id + 1;
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&vec);
    std::ofstream::~ofstream(&ofs);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&word,filename," cannot be opened for saving vectors!");
  std::invalid_argument::invalid_argument(this_00,(string *)&word);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::saveVectors(const std::string& filename) {
  std::ofstream ofs(filename);
  if (!ofs.is_open()) {
    throw std::invalid_argument(
        filename + " cannot be opened for saving vectors!");
  }
  ofs << dict_->nwords() << " " << args_->dim << std::endl;
  Vector vec(args_->dim);
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
    getWordVector(vec, word);
    ofs << word << " " << vec << std::endl;
  }
}